

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_util.c
# Opt level: O2

int aom_noise_data_validate(double *data,int w,int h)

{
  long lVar1;
  int iVar2;
  void *memblk;
  void *memblk_00;
  void *memblk_01;
  void *memblk_02;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  size_t num;
  char *pcVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  num = (size_t)w;
  memblk = aom_calloc(num,8);
  memblk_00 = aom_calloc(num,8);
  memblk_01 = aom_calloc((long)h,8);
  memblk_02 = aom_calloc((long)h,8);
  auVar8._0_4_ = -(uint)((int)memblk == 0 && (int)((ulong)memblk >> 0x20) == 0);
  auVar8._4_4_ = -(uint)((int)memblk_00 == 0 && (int)((ulong)memblk_00 >> 0x20) == 0);
  auVar8._8_4_ = -(uint)((int)memblk_01 == 0 && (int)((ulong)memblk_01 >> 0x20) == 0);
  auVar8._12_4_ = -(uint)((int)memblk_02 == 0 && (int)((ulong)memblk_02 >> 0x20) == 0);
  iVar2 = movmskps((int)memblk_02,auVar8);
  if (iVar2 == 0) {
    uVar4 = 0;
    uVar7 = 0;
    if (0 < w) {
      uVar7 = (ulong)(uint)w;
    }
    uVar3 = 0;
    if (0 < h) {
      uVar3 = (ulong)(uint)h;
    }
    dVar11 = 0.0;
    dVar12 = 0.0;
    for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
      for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
        dVar10 = data[uVar5];
        dVar9 = dVar10 * dVar10;
        *(double *)((long)memblk_00 + uVar5 * 8) = *(double *)((long)memblk_00 + uVar5 * 8) + dVar9;
        *(double *)((long)memblk_02 + uVar4 * 8) = *(double *)((long)memblk_02 + uVar4 * 8) + dVar9;
        *(double *)((long)memblk + uVar5 * 8) = *(double *)((long)memblk + uVar5 * 8) + dVar10;
        dVar11 = dVar11 + dVar10;
        *(double *)((long)memblk_01 + uVar4 * 8) = dVar10 + *(double *)((long)memblk_01 + uVar4 * 8)
        ;
        dVar12 = dVar12 + dVar9;
      }
      data = data + num;
    }
    dVar11 = dVar11 / (double)(h * w);
    dVar12 = dVar12 / (double)(h * w) - dVar11 * dVar11;
    uVar4 = 0;
    iVar2 = 1;
    do {
      if (uVar3 == uVar4) goto LAB_002535af;
      dVar10 = *(double *)((long)memblk_01 + uVar4 * 8) / (double)h;
      *(double *)((long)memblk_01 + uVar4 * 8) = dVar10;
      dVar10 = *(double *)((long)memblk_02 + uVar4 * 8) / (double)h - dVar10 * dVar10;
      *(double *)((long)memblk_02 + uVar4 * 8) = dVar10;
      if (2.0 <= ABS(dVar10 - dVar12)) {
        pcVar6 = "Variance distance too large %f %f\n";
        goto LAB_0025357e;
      }
      lVar1 = uVar4 * 8;
      uVar4 = uVar4 + 1;
    } while (ABS(*(double *)((long)memblk_01 + lVar1) - dVar11) < 2.0);
    pcVar6 = "Mean distance too large %f %f\n";
LAB_0025357e:
    fprintf(_stderr,pcVar6);
    iVar2 = 0;
LAB_002535af:
    uVar4 = 0;
    do {
      if (uVar7 == uVar4) goto LAB_00253646;
      dVar10 = *(double *)((long)memblk + uVar4 * 8) / (double)w;
      *(double *)((long)memblk + uVar4 * 8) = dVar10;
      dVar10 = *(double *)((long)memblk_00 + uVar4 * 8) / (double)w - dVar10 * dVar10;
      *(double *)((long)memblk_00 + uVar4 * 8) = dVar10;
      if (2.0 <= ABS(dVar10 - dVar12)) {
        pcVar6 = "Variance distance too large %f %f\n";
        goto LAB_0025363d;
      }
      lVar1 = uVar4 * 8;
      uVar4 = uVar4 + 1;
    } while (ABS(*(double *)((long)memblk + lVar1) - dVar11) < 2.0);
    pcVar6 = "Mean distance too large %f %f\n";
LAB_0025363d:
    fprintf(_stderr,pcVar6);
    iVar2 = 0;
LAB_00253646:
    aom_free(memblk);
    aom_free(memblk_01);
    aom_free(memblk_00);
    aom_free(memblk_02);
  }
  else {
    aom_free(memblk);
    aom_free(memblk_01);
    aom_free(memblk_00);
    aom_free(memblk_02);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int aom_noise_data_validate(const double *data, int w, int h) {
  const double kVarianceThreshold = 2;
  const double kMeanThreshold = 2;

  int x = 0, y = 0;
  int ret_value = 1;
  double var = 0, mean = 0;
  double *mean_x, *mean_y, *var_x, *var_y;

  // Check that noise variance is not increasing in x or y
  // and that the data is zero mean.
  mean_x = (double *)aom_calloc(w, sizeof(*mean_x));
  var_x = (double *)aom_calloc(w, sizeof(*var_x));
  mean_y = (double *)aom_calloc(h, sizeof(*mean_x));
  var_y = (double *)aom_calloc(h, sizeof(*var_y));
  if (!(mean_x && var_x && mean_y && var_y)) {
    aom_free(mean_x);
    aom_free(mean_y);
    aom_free(var_x);
    aom_free(var_y);
    return 0;
  }

  for (y = 0; y < h; ++y) {
    for (x = 0; x < w; ++x) {
      const double d = data[y * w + x];
      var_x[x] += d * d;
      var_y[y] += d * d;
      mean_x[x] += d;
      mean_y[y] += d;
      var += d * d;
      mean += d;
    }
  }
  mean /= (w * h);
  var = var / (w * h) - mean * mean;

  for (y = 0; y < h; ++y) {
    mean_y[y] /= h;
    var_y[y] = var_y[y] / h - mean_y[y] * mean_y[y];
    if (fabs(var_y[y] - var) >= kVarianceThreshold) {
      fprintf(stderr, "Variance distance too large %f %f\n", var_y[y], var);
      ret_value = 0;
      break;
    }
    if (fabs(mean_y[y] - mean) >= kMeanThreshold) {
      fprintf(stderr, "Mean distance too large %f %f\n", mean_y[y], mean);
      ret_value = 0;
      break;
    }
  }

  for (x = 0; x < w; ++x) {
    mean_x[x] /= w;
    var_x[x] = var_x[x] / w - mean_x[x] * mean_x[x];
    if (fabs(var_x[x] - var) >= kVarianceThreshold) {
      fprintf(stderr, "Variance distance too large %f %f\n", var_x[x], var);
      ret_value = 0;
      break;
    }
    if (fabs(mean_x[x] - mean) >= kMeanThreshold) {
      fprintf(stderr, "Mean distance too large %f %f\n", mean_x[x], mean);
      ret_value = 0;
      break;
    }
  }

  aom_free(mean_x);
  aom_free(mean_y);
  aom_free(var_x);
  aom_free(var_y);

  return ret_value;
}